

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O1

void luaX_lexerror(LexState *ls,char *msg,int token)

{
  CallInfo *pCVar1;
  StkId pTVar2;
  char *pcVar3;
  char *pcVar4;
  StkId pTVar5;
  undefined1 uVar6;
  lua_State *plVar7;
  char buff [80];
  char acStack_78 [88];
  
  luaO_chunkid(acStack_78,(char *)(ls->source + 1),0x50);
  pcVar3 = luaO_pushfstring(ls->L,"%s:%d: %s",acStack_78,(ulong)(uint)ls->linenumber,msg);
  if (token != 0) {
    plVar7 = ls->L;
    if (token - 0x11cU < 3) {
      save(ls,0);
      pcVar4 = ls->buff->buffer;
    }
    else {
      pcVar4 = luaX_token2str(ls,token);
    }
    luaO_pushfstring(plVar7,"%s near \'%s\'",pcVar3,pcVar4);
  }
  plVar7 = ls->L;
  uVar6 = 3;
  luaD_throw(plVar7,3);
  pCVar1 = plVar7->end_ci;
  if (pCVar1->top < (StkId)((long)&pCVar1->func->value + 1)) {
    if ((StkId)0x7ffffffffffffffd < pCVar1->top) {
      luaX_lexerror((LexState *)plVar7,"lexical element too long",0);
    }
    pTVar2 = (StkId)((long)pCVar1->top * 2);
    if (pTVar2 == (StkId)0xfffffffffffffffe) {
      luaG_runerror((lua_State *)plVar7->stack_last,"memory allocation error: block too big");
    }
    pTVar5 = (StkId)luaM_realloc_((lua_State *)plVar7->stack_last,pCVar1->base,(size_t)pCVar1->top,
                                  (size_t)pTVar2);
    pCVar1->base = pTVar5;
    pCVar1->top = pTVar2;
  }
  pTVar2 = pCVar1->func;
  pCVar1->func = (StkId)((long)&pTVar2->value + 1);
  *(undefined1 *)((long)&pTVar2->value + (long)pCVar1->base) = uVar6;
  return;
}

Assistant:

static void luaX_lexerror(LexState*ls,const char*msg,int token){
char buff[80];
luaO_chunkid(buff,getstr(ls->source),80);
msg=luaO_pushfstring(ls->L,"%s:%d: %s",buff,ls->linenumber,msg);
if(token)
luaO_pushfstring(ls->L,"%s near "LUA_QL("%s"),msg,txtToken(ls,token));
luaD_throw(ls->L,3);
}